

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase93::run(TestCase93 *this)

{
  undefined8 *puVar1;
  Builder builder_00;
  Builder builder_01;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> segments;
  ArrayPtr<const_capnp::word> *pAVar2;
  SegmentInit *pSVar3;
  long lVar4;
  size_t sVar5;
  ArrayPtr<const_capnp::word> *iter;
  long lVar6;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar7;
  Reader value;
  int local_284;
  ulong local_280;
  Array<capnp::MessageBuilder::SegmentInit> segInits;
  Builder local_260;
  Builder local_238;
  Builder local_210;
  TestInitMessageBuilder builder2;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,1,FIXED_SIZE);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_210,&builder.super_MessageBuilder);
  builder_00._builder.capTable = local_210._builder.capTable;
  builder_00._builder.segment = local_210._builder.segment;
  builder_00._builder.data = local_210._builder.data;
  builder_00._builder.pointers = local_210._builder.pointers;
  builder_00._builder.dataSize = local_210._builder.dataSize;
  builder_00._builder.pointerCount = local_210._builder.pointerCount;
  builder_00._builder._38_2_ = local_210._builder._38_2_;
  initTestMessage(builder_00);
  AVar7 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  sVar5 = AVar7.size_;
  pAVar2 = AVar7.ptr;
  if (sVar5 != 1) {
    pSVar3 = kj::_::HeapArrayDisposer::allocateUninitialized<capnp::MessageBuilder::SegmentInit>
                       (sVar5);
    builder2.super_MessageBuilder.arenaSpace[2] = &kj::_::HeapArrayDisposer::instance;
    lVar4 = 0;
    for (lVar6 = sVar5 << 4; lVar6 != 0; lVar6 = lVar6 + -0x10) {
      puVar1 = (undefined8 *)((long)&(pSVar3->space).ptr + lVar4);
      sVar5 = pAVar2->size_;
      *puVar1 = pAVar2->ptr;
      puVar1[1] = sVar5;
      puVar1[2] = sVar5;
      pAVar2 = pAVar2 + 1;
      lVar4 = lVar4 + 0x18;
    }
    segInits.size_ = lVar4 / 0x18;
    segInits.ptr._0_4_ = SUB84(pSVar3,0);
    segInits.ptr._4_4_ = (undefined4)((ulong)pSVar3 >> 0x20);
    segInits.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    builder2.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)0x0;
    builder2.super_MessageBuilder.arenaSpace[0] = (void *)0x0;
    builder2.super_MessageBuilder.arenaSpace[1] = (void *)0x0;
    kj::ArrayBuilder<capnp::MessageBuilder::SegmentInit>::dispose
              ((ArrayBuilder<capnp::MessageBuilder::SegmentInit> *)&builder2);
    segments.ptr._4_4_ = segInits.ptr._4_4_;
    segments.ptr._0_4_ = segInits.ptr._0_4_;
    segments.size_ = segInits.size_;
    TestInitMessageBuilder::TestInitMessageBuilder(&builder2,segments);
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_238,&builder2.super_MessageBuilder);
    builder_01._builder.capTable = local_238._builder.capTable;
    builder_01._builder.segment = local_238._builder.segment;
    builder_01._builder.data = local_238._builder.data;
    builder_01._builder.pointers = local_238._builder.pointers;
    builder_01._builder.dataSize = local_238._builder.dataSize;
    builder_01._builder.pointerCount = local_238._builder.pointerCount;
    builder_01._builder._38_2_ = local_238._builder._38_2_;
    checkTestMessage(builder_01);
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_260,&builder2.super_MessageBuilder);
    *(undefined8 *)((long)local_260._builder.data + 8) = 0x1e1b9;
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_260,&builder.super_MessageBuilder);
    if (*(long *)((long)local_260._builder.data + 8) != 0x1e1b9 && kj::_::Debug::minSeverity < 3) {
      local_284 = 0x1e1b9;
      MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
                (&local_260,&builder.super_MessageBuilder);
      local_280 = *(ulong *)((long)local_260._builder.data + 8);
      kj::_::Debug::log<char_const(&)[79],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x73,ERROR,
                 "\"failed: expected \" \"(123321) == (builder.getRoot<TestAllTypes>().getInt64Field())\", 123321, builder.getRoot<TestAllTypes>().getInt64Field()"
                 ,(char (*) [79])
                  "failed: expected (123321) == (builder.getRoot<TestAllTypes>().getInt64Field())",
                 &local_284,(long *)&local_280);
    }
    if (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr != 0) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_260._builder.segment =
           (SegmentBuilder *)
           (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr) / 0x18
           );
      local_280 = local_280 & 0xffffffff00000000;
      kj::_::Debug::log<char_const(&)[54],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x76,ERROR,
                 "\"failed: expected \" \"(0) == (builder2.allocations.size())\", 0, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (0) == (builder2.allocations.size())",
                 (int *)&local_280,(unsigned_long *)&local_260);
    }
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_260,&builder2.super_MessageBuilder);
    value.super_StringPtr.content.size_ = 10;
    value.super_StringPtr.content.ptr = "foobarbaz";
    capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_260,value);
    if (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr != 0x18) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_260._builder.segment =
           (SegmentBuilder *)
           (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr) / 0x18
           );
      local_280 = CONCAT44(local_280._4_4_,1);
      kj::_::Debug::log<char_const(&)[54],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0x78,ERROR,
                 "\"failed: expected \" \"(1) == (builder2.allocations.size())\", 1, builder2.allocations.size()"
                 ,(char (*) [54])"failed: expected (1) == (builder2.allocations.size())",
                 (int *)&local_280,(unsigned_long *)&local_260);
    }
    TestInitMessageBuilder::~TestInitMessageBuilder(&builder2);
    kj::Array<capnp::MessageBuilder::SegmentInit>::~Array(&segInits);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  segInits.ptr._0_4_ = 1;
  local_260._builder.segment = (SegmentBuilder *)0x1;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_long>
            ((Fault *)&builder2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
             ,0x67,FAILED,"(1) != (segs.size())","1, segs.size()",(int *)&segInits,
             (unsigned_long *)&local_260);
  kj::_::Debug::Fault::fatal((Fault *)&builder2);
}

Assistant:

TEST(Message, MessageBuilderInitMultiSegment) {
  // Same as previous test, but with a message containing many segments.

  MallocMessageBuilder builder(1, AllocationStrategy::FIXED_SIZE);
  initTestMessage(builder.getRoot<TestAllTypes>());

  // Pull the segments out and make a segment init table out of them.
  //
  // We const_cast for simplicity of implementing the test, but you shouldn't do that at home. :)
  auto segs = builder.getSegmentsForOutput();
  ASSERT_NE(1, segs.size());

  auto segInits = KJ_MAP(seg, segs) -> MessageBuilder::SegmentInit {
    return { kj::arrayPtr(const_cast<word*>(seg.begin()), seg.size()), seg.size() };
  };

  // Init a new builder from the old segments.
  TestInitMessageBuilder builder2(segInits);
  checkTestMessage(builder2.getRoot<TestAllTypes>());

  // Verify that they're really using the same underlying memory.
  builder2.getRoot<TestAllTypes>().setInt64Field(123321);
  EXPECT_EQ(123321, builder.getRoot<TestAllTypes>().getInt64Field());

  // Force builder2 to allocate new space.
  EXPECT_EQ(0, builder2.allocations.size());
  builder2.getRoot<TestAllTypes>().setTextField("foobarbaz");
  EXPECT_EQ(1, builder2.allocations.size());
}